

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::updateSimplicity
          (Geometry<std::allocator<unsigned_long>_> *this)

{
  size_t sVar1;
  size_t *psVar2;
  ulong local_18;
  size_t j;
  Geometry<std::allocator<unsigned_long>_> *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = dimension(this);
    if (sVar1 <= local_18) {
      this->isSimple_ = true;
      return;
    }
    psVar2 = shapeStrides(this,local_18);
    sVar1 = *psVar2;
    psVar2 = strides(this,local_18);
    if (sVar1 != *psVar2) break;
    local_18 = local_18 + 1;
  }
  this->isSimple_ = false;
  return;
}

Assistant:

inline void
Geometry<A>::updateSimplicity()
{ 
    for(std::size_t j=0; j<dimension(); ++j) {
        if(shapeStrides(j) != strides(j)) {
            isSimple_ = false;
            return;
        }
    }
    isSimple_ = true; 
    // a 0-dimensional geometry is simple
}